

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1407::run(TestCase1407 *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  bool local_4b9;
  undefined1 local_4b8 [7];
  bool _kj_shouldLog_1;
  bool local_48a;
  DebugExpression<bool> local_489;
  undefined1 local_488 [7];
  DebugExpression<bool> _kjCondition_1;
  Reader local_458;
  bool local_421;
  undefined1 local_420 [7];
  bool _kj_shouldLog;
  bool local_3f2;
  DebugExpression<bool> local_3f1;
  undefined1 local_3f0 [7];
  DebugExpression<bool> _kjCondition;
  Reader local_3c0;
  undefined1 local_390 [8];
  MallocMessageBuilder builder2;
  Builder local_278;
  Builder local_250;
  Builder local_228;
  Builder local_200;
  Builder local_1d8;
  Builder local_1b0;
  Builder local_188;
  undefined1 local_160 [8];
  Builder list;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase1407 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestLists>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestLists::Builder::initList1
            ((Builder *)local_160,(Builder *)local_128,8);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            (&local_188,(Builder *)local_160,0);
  capnproto_test::capnp::test::TestLists::Struct1::Builder::setF(&local_188,true);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            (&local_1b0,(Builder *)local_160,1);
  capnproto_test::capnp::test::TestLists::Struct1::Builder::setF(&local_1b0,true);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            (&local_1d8,(Builder *)local_160,2);
  capnproto_test::capnp::test::TestLists::Struct1::Builder::setF(&local_1d8,false);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            (&local_200,(Builder *)local_160,3);
  capnproto_test::capnp::test::TestLists::Struct1::Builder::setF(&local_200,true);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            (&local_228,(Builder *)local_160,4);
  capnproto_test::capnp::test::TestLists::Struct1::Builder::setF(&local_228,true);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            (&local_250,(Builder *)local_160,5);
  capnproto_test::capnp::test::TestLists::Struct1::Builder::setF(&local_250,false);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            (&local_278,(Builder *)local_160,6);
  capnproto_test::capnp::test::TestLists::Struct1::Builder::setF(&local_278,true);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)&builder2.moreSegments.builder.disposer,(Builder *)local_160,7);
  capnproto_test::capnp::test::TestLists::Struct1::Builder::setF
            ((Builder *)&builder2.moreSegments.builder.disposer,false);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_390,0x400,GROW_HEURISTICALLY);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::asReader
            ((Reader *)local_3f0,(Builder *)local_160);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Reader::operator[]
            (&local_3c0,(Reader *)local_3f0,2);
  MessageBuilder::setRoot<capnproto_test::capnp::test::TestLists::Struct1::Reader>
            ((MessageBuilder *)local_390,&local_3c0);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestLists::Struct1>
            ((Builder *)local_420,(MessageBuilder *)local_390);
  local_3f2 = capnproto_test::capnp::test::TestLists::Struct1::Builder::getF((Builder *)local_420);
  local_3f2 = !local_3f2;
  local_3f1 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3f2);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_3f1);
  if (!bVar1) {
    local_421 = kj::_::Debug::shouldLog(ERROR);
    while (local_421 != false) {
      kj::_::Debug::log<char_const(&)[72],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x590,ERROR,
                 "\"failed: expected \" \"!(builder2.getRoot<test::TestLists::Struct1>().getF())\", _kjCondition"
                 ,(char (*) [72])
                  "failed: expected !(builder2.getRoot<test::TestLists::Struct1>().getF())",
                 &local_3f1);
      local_421 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::asReader
            ((Reader *)local_488,(Builder *)local_160);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Reader::operator[]
            (&local_458,(Reader *)local_488,6);
  MessageBuilder::setRoot<capnproto_test::capnp::test::TestLists::Struct1::Reader>
            ((MessageBuilder *)local_390,&local_458);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestLists::Struct1>
            ((Builder *)local_4b8,(MessageBuilder *)local_390);
  local_48a = capnproto_test::capnp::test::TestLists::Struct1::Builder::getF((Builder *)local_4b8);
  local_489 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_48a);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_489);
  if (!bVar1) {
    local_4b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_4b9 != false) {
      kj::_::Debug::log<char_const(&)[69],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x592,ERROR,
                 "\"failed: expected \" \"builder2.getRoot<test::TestLists::Struct1>().getF()\", _kjCondition"
                 ,(char (*) [69])
                  "failed: expected builder2.getRoot<test::TestLists::Struct1>().getF()",&local_489)
      ;
      local_4b9 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_390);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Encoding, OneBitStructSetters) {
  // Test case of setting a 1-bit struct.

  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestLists>();
  auto list = root.initList1(8);
  list[0].setF(true);
  list[1].setF(true);
  list[2].setF(false);
  list[3].setF(true);
  list[4].setF(true);
  list[5].setF(false);
  list[6].setF(true);
  list[7].setF(false);

  MallocMessageBuilder builder2;
  builder2.setRoot(list.asReader()[2]);
  EXPECT_FALSE(builder2.getRoot<test::TestLists::Struct1>().getF());
  builder2.setRoot(list.asReader()[6]);
  EXPECT_TRUE(builder2.getRoot<test::TestLists::Struct1>().getF());
}